

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O1

void ImGui_ImplGlfw_WindowSizeCallback(GLFWwindow *window,int param_2,int param_3)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  ImGuiViewport *pIVar4;
  
  pIVar4 = ImGui::FindViewportByPlatformHandle(window);
  if (pIVar4 != (ImGuiViewport *)0x0) {
    pvVar2 = pIVar4->PlatformUserData;
    if (pvVar2 != (void *)0x0) {
      iVar3 = ImGui::GetFrameCount();
      iVar1 = *(int *)((long)pvVar2 + 0xc);
      *(undefined4 *)((long)pvVar2 + 0xc) = 0xffffffff;
      if (iVar3 <= iVar1 + 1) {
        return;
      }
    }
    pIVar4->PlatformRequestResize = true;
  }
  return;
}

Assistant:

static void ImGui_ImplGlfw_WindowSizeCallback(GLFWwindow* window, int, int)
{
    if (ImGuiViewport* viewport = ImGui::FindViewportByPlatformHandle(window))
    {
        if (ImGuiViewportDataGlfw* data = (ImGuiViewportDataGlfw*)viewport->PlatformUserData)
        {
            // GLFW may dispatch window size event after calling glfwSetWindowSize().
            // However depending on the platform the callback may be invoked at different time: on Windows it
            // appears to be called within the glfwSetWindowSize() call whereas on Linux it is queued and invoked
            // during glfwPollEvents().
            // Because the event doesn't always fire on glfwSetWindowSize() we use a frame counter tag to only
            // ignore recent glfwSetWindowSize() calls.
            bool ignore_event = (ImGui::GetFrameCount() <= data->IgnoreWindowSizeEventFrame + 1);
            data->IgnoreWindowSizeEventFrame = -1;
            if (ignore_event)
                return;
        }
        viewport->PlatformRequestResize = true;
    }
}